

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O2

ModelPtr __thiscall libcellml::AnyCellmlElement::model(AnyCellmlElement *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  undefined8 *in_RSI;
  shared_ptr<libcellml::Model> sVar1;
  ModelPtr MVar2;
  
  if ((*(uint *)*in_RSI | 4) == 7) {
    sVar1 = std::any_cast<std::shared_ptr<libcellml::Model>>((any *)this);
    in_RDX = sVar1.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
  }
  else {
    this->mPimpl = (AnyCellmlElementImpl *)0x0;
    this[1].mPimpl = (AnyCellmlElementImpl *)0x0;
  }
  MVar2.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  MVar2.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ModelPtr)MVar2.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ModelPtr AnyCellmlElement::model() const
{
    if ((mPimpl->mType == CellmlElementType::ENCAPSULATION)
        || (mPimpl->mType == CellmlElementType::MODEL)) {
        try {
            return std::any_cast<ModelPtr>(mPimpl->mItem);
        } catch (const std::bad_any_cast &) {
            return nullptr;
        }
    }

    return nullptr;
}